

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void VP8LBitsEntropyUnrefined(uint32_t *array,int n,VP8LBitEntropy *entropy)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  entropy->max_val = 0;
  entropy->nonzero_code = 0xffff;
  entropy->sum = 0;
  entropy->nonzeros = 0;
  uVar7 = 0;
  if (n < 1) {
    n = 0;
  }
  iVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  for (uVar8 = 0; uVar3 = (uint)uVar4, (uint)n != uVar8; uVar8 = uVar8 + 1) {
    uVar1 = array[uVar8];
    if ((ulong)uVar1 != 0) {
      entropy->sum = uVar3 + uVar1;
      entropy->nonzero_code = (uint32_t)uVar8;
      iVar6 = iVar6 + 1;
      entropy->nonzeros = iVar6;
      if (uVar1 < 0x100) {
        uVar2 = kSLog2Table[uVar1];
      }
      else {
        uVar2 = (*VP8LFastSLog2Slow)(uVar1);
      }
      uVar4 = (ulong)(uVar3 + uVar1);
      uVar5 = uVar5 + uVar2;
      entropy->entropy = uVar5;
      if (uVar7 < uVar1) {
        entropy->max_val = uVar1;
        uVar7 = uVar1;
      }
    }
  }
  if (uVar3 < 0x100) {
    uVar2 = kSLog2Table[uVar4];
  }
  else {
    uVar2 = (*VP8LFastSLog2Slow)(uVar3);
  }
  entropy->entropy = uVar2 - uVar5;
  return;
}

Assistant:

void VP8LBitsEntropyUnrefined(const uint32_t* WEBP_RESTRICT const array, int n,
                              VP8LBitEntropy* WEBP_RESTRICT const entropy) {
  int i;

  VP8LBitEntropyInit(entropy);

  for (i = 0; i < n; ++i) {
    if (array[i] != 0) {
      entropy->sum += array[i];
      entropy->nonzero_code = i;
      ++entropy->nonzeros;
      entropy->entropy += VP8LFastSLog2(array[i]);
      if (entropy->max_val < array[i]) {
        entropy->max_val = array[i];
      }
    }
  }
  entropy->entropy = VP8LFastSLog2(entropy->sum) - entropy->entropy;
}